

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

void __thiscall
kainjow::mustache::
delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
delimiter_set(delimiter_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  std::__cxx11::string::string
            ((string *)this,(string *)delimiter_set<std::__cxx11::string>::default_begin);
  std::__cxx11::string::string
            ((string *)&this->end,(string *)delimiter_set<std::__cxx11::string>::default_end);
  return;
}

Assistant:

delimiter_set()
        : begin(default_begin)
        , end(default_end)
    {}